

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O2

void __thiscall Assimp::glTFExporter::ExportScene(glTFExporter *this)

{
  element_type *peVar1;
  Ref<glTF::Scene> RVar2;
  Ref<glTF::Node> local_28;
  
  RVar2 = glTF::LazyDict<glTF::Scene>::Create
                    (&((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->scenes,"defaultScene");
  peVar1 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((int)((ulong)((long)*(pointer *)
                           ((long)&(peVar1->nodes).mObjs.
                                   super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>.
                                   _M_impl.super__Vector_impl_data + 8) -
                   (long)(peVar1->nodes).mObjs.
                         super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) != 0) {
    local_28.vector = &(peVar1->nodes).mObjs;
    local_28.index = 0;
    std::vector<glTF::Ref<glTF::Node>,std::allocator<glTF::Ref<glTF::Node>>>::
    emplace_back<glTF::Ref<glTF::Node>>
              ((vector<glTF::Ref<glTF::Node>,std::allocator<glTF::Ref<glTF::Node>>> *)
               &((RVar2.vector)->super__Vector_base<glTF::Scene_*,_std::allocator<glTF::Scene_*>_>).
                _M_impl.super__Vector_impl_data._M_start[RVar2.index]->nodes,&local_28);
    peVar1 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  (peVar1->scene).vector = RVar2.vector;
  (peVar1->scene).index = RVar2.index;
  return;
}

Assistant:

void glTFExporter::ExportScene()
{
    const char* sceneName = "defaultScene";
    Ref<Scene> scene = mAsset->scenes.Create(sceneName);

    // root node will be the first one exported (idx 0)
    if (mAsset->nodes.Size() > 0) {
        scene->nodes.push_back(mAsset->nodes.Get(0u));
    }

    // set as the default scene
    mAsset->scene = scene;
}